

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O3

void __thiscall SpiAnalyzer::AdvanceToActiveEnableEdge(SpiAnalyzer *this)

{
  BitState BVar1;
  BitState BVar2;
  U64 UVar3;
  
  if (this->mEnable != (AnalyzerChannelData *)0x0) {
    BVar2 = AnalyzerChannelData::GetBitState();
    BVar1 = ((this->mSettings)._M_ptr)->mEnableActiveState;
    AnalyzerChannelData::AdvanceToNextEdge();
    if (BVar2 == BVar1) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    UVar3 = AnalyzerChannelData::GetSampleNumber();
    this->mCurrentSample = UVar3;
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mClock);
    return;
  }
  UVar3 = AnalyzerChannelData::GetSampleNumber();
  this->mCurrentSample = UVar3;
  return;
}

Assistant:

void SpiAnalyzer::AdvanceToActiveEnableEdge()
{
    if( mEnable != NULL )
    {
        if( mEnable->GetBitState() != mSettings->mEnableActiveState )
        {
            mEnable->AdvanceToNextEdge();
        }
        else
        {
            mEnable->AdvanceToNextEdge();
            mEnable->AdvanceToNextEdge();
        }
        mCurrentSample = mEnable->GetSampleNumber();
        mClock->AdvanceToAbsPosition( mCurrentSample );
    }
    else
    {
        mCurrentSample = mClock->GetSampleNumber();
    }
}